

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

integerPart __thiscall llvm::detail::IEEEFloat::addSignificand(IEEEFloat *this,IEEEFloat *rhs)

{
  uint uVar1;
  WordType WVar2;
  Significand *rhs_00;
  Significand *dst;
  
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x397,
                  "IEEEFloat::integerPart llvm::detail::IEEEFloat::addSignificand(const IEEEFloat &)"
                 );
  }
  if (this->exponent == rhs->exponent) {
    uVar1 = this->semantics->precision;
    dst = &this->significand;
    if (uVar1 - 0x40 < 0xffffff80) {
      dst = (Significand *)(this->significand).parts;
    }
    if (rhs->semantics->precision - 0x40 < 0xffffff80) {
      rhs_00 = (Significand *)(rhs->significand).parts;
    }
    else {
      rhs_00 = &rhs->significand;
    }
    WVar2 = APInt::tcAdd(&dst->part,&rhs_00->part,0,uVar1 + 0x40 >> 6);
    return WVar2;
  }
  __assert_fail("exponent == rhs.exponent",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x398,
                "IEEEFloat::integerPart llvm::detail::IEEEFloat::addSignificand(const IEEEFloat &)")
  ;
}

Assistant:

IEEEFloat::integerPart IEEEFloat::addSignificand(const IEEEFloat &rhs) {
  integerPart *parts;

  parts = significandParts();

  assert(semantics == rhs.semantics);
  assert(exponent == rhs.exponent);

  return APInt::tcAdd(parts, rhs.significandParts(), 0, partCount());
}